

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shadertoy.cpp
# Opt level: O2

vector<st::ShaderOutput,_std::allocator<st::ShaderOutput>_> *
st::ParseOutputs(vector<st::ShaderOutput,_std::allocator<st::ShaderOutput>_> *__return_storage_ptr__
                ,Json *outputs)

{
  pointer pJVar1;
  bool bVar2;
  vector<json11::Json,_std::allocator<json11::Json>_> *pvVar3;
  Json *pJVar4;
  pointer this;
  ShaderOutput data;
  allocator<char> local_59;
  value_type local_58;
  string local_50;
  
  (__return_storage_ptr__->super__Vector_base<st::ShaderOutput,_std::allocator<st::ShaderOutput>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<st::ShaderOutput,_std::allocator<st::ShaderOutput>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<st::ShaderOutput,_std::allocator<st::ShaderOutput>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = json11::Json::is_array(outputs);
  if (bVar2) {
    pvVar3 = json11::Json::array_items(outputs);
    pJVar1 = (pvVar3->super__Vector_base<json11::Json,_std::allocator<json11::Json>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (this = (pvVar3->super__Vector_base<json11::Json,_std::allocator<json11::Json>_>)._M_impl.
                super__Vector_impl_data._M_start; this != pJVar1; this = this + 1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"channel",&local_59);
      pJVar4 = json11::Json::operator[](this,&local_50);
      local_58.Channel = json11::Json::int_value(pJVar4);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"id",&local_59);
      pJVar4 = json11::Json::operator[](this,&local_50);
      local_58.ID = json11::Json::int_value(pJVar4);
      std::__cxx11::string::~string((string *)&local_50);
      std::vector<st::ShaderOutput,_std::allocator<st::ShaderOutput>_>::push_back
                (__return_storage_ptr__,&local_58);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ShaderOutput> ParseOutputs(const json11::Json& outputs)
	{
		std::vector<ShaderOutput> ret;
		if (outputs.is_array()) {
			for (const auto& output : outputs.array_items()) {
				ShaderOutput data;
				data.Channel = output["channel"].int_value();
				data.ID = output["id"].int_value();
				ret.push_back(data);
			}
		}
		return ret;
	}